

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyi_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::python::PyiGenerator::PrintImportForDescriptor
          (PyiGenerator *this,FileDescriptor *desc,
          flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *seen_aliases,bool *has_importlib)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  PyiGenerator *pPVar3;
  bool bVar4;
  AlphaNum *pAVar5;
  char *extraout_RDX;
  AlphaNum *in_R9;
  AlphaNum *pAVar6;
  string_view module_name_00;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view filename_00;
  string_view module_name;
  string alias;
  string import_statement;
  string_view filename;
  string module_name_owned;
  basic_string_view<char,_std::char_traits<char>_> local_1a8;
  bool *local_198;
  AlphaNum local_190;
  string local_160;
  AlphaNum *local_140;
  PyiGenerator *local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string_view<char,_std::char_traits<char>_> local_110;
  AlphaNum local_100;
  string local_d0;
  undefined1 local_b0 [48];
  string local_80;
  AlphaNum local_60;
  
  local_110._M_str = (desc->name_->_M_dataplus)._M_p;
  local_110._M_len = desc->name_->_M_string_length;
  filename_00._M_str = has_importlib;
  filename_00._M_len = (size_t)local_110._M_str;
  local_198 = has_importlib;
  StrippedModuleName_abi_cxx11_(&local_d0,(python *)local_110._M_len,filename_00);
  local_1a8._M_len = local_d0._M_string_length;
  local_1a8._M_str = local_d0._M_dataplus._M_p;
  pAVar5 = (AlphaNum *)local_d0._M_string_length;
  if ((AlphaNum *)local_d0._M_string_length == (AlphaNum *)0x0) {
LAB_001fcc79:
    pAVar6 = (AlphaNum *)0xffffffffffffffff;
  }
  else {
    do {
      pAVar6 = (AlphaNum *)(pAVar5[-1].digits_ + 0x1f);
      if (pAVar5 == (AlphaNum *)0x0) goto LAB_001fcc79;
      pcVar1 = local_d0._M_dataplus._M_p + -1 + (long)pAVar5;
      pAVar5 = pAVar6;
    } while (*pcVar1 != '.');
  }
  local_190.piece_._M_str = "_";
  local_190.piece_._M_len = 1;
  local_140 = (AlphaNum *)((long)&(pAVar6->piece_)._M_len + 1);
  local_100.piece_._M_len = local_d0._M_string_length - (long)local_140;
  if (local_d0._M_string_length < local_140) {
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr");
  }
  local_100.piece_._M_str = local_d0._M_dataplus._M_p + (long)local_140;
  local_138 = this;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_160,(lts_20250127 *)&local_190,&local_100,(AlphaNum *)local_d0._M_string_length)
  ;
  pAVar5 = (AlphaNum *)local_d0._M_string_length;
  while( true ) {
    local_190.piece_ =
         (string_view)
         absl::lts_20250127::container_internal::
         raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
         ::find<std::__cxx11::string>
                   ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                     *)seen_aliases,&local_160);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::AssertNotDebugCapacity
              (&seen_aliases->
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              );
    local_100.piece_._M_len = 0;
    bVar4 = absl::lts_20250127::container_internal::operator==
                      ((iterator *)&local_190,(iterator *)&local_100);
    if (bVar4) break;
    local_190.piece_._M_str = "_1";
    local_190.piece_._M_len = 2;
    absl::lts_20250127::StrAppend(&local_160,&local_190);
  }
  module_name_00._M_str = extraout_RDX;
  module_name_00._M_len = (size_t)local_1a8._M_str;
  bVar4 = ContainsPythonKeyword((python *)local_1a8._M_len,module_name_00);
  pPVar3 = local_138;
  if (bVar4) {
    if (*local_198 == false) {
      text._M_str = "import importlib\n";
      text._M_len = 0x11;
      io::Printer::Print<>(local_138->printer_,text);
      *local_198 = true;
    }
    text_00._M_str = "$alias$ = importlib.import_module(\'$name$\')\n";
    text_00._M_len = 0x2c;
    io::Printer::
    Print<char[6],std::__cxx11::string,char[5],std::basic_string_view<char,std::char_traits<char>>>
              (pPVar3->printer_,text_00,(char (*) [6])0x564a7c,&local_160,(char (*) [5])0x7203be,
               &local_1a8);
    goto LAB_001fcfa4;
  }
  paVar2 = &local_130.field_2;
  local_130._M_string_length = 0;
  local_130.field_2._M_local_buf[0] = '\0';
  local_130._M_dataplus._M_p = (pointer)paVar2;
  if (pAVar6 == (AlphaNum *)0xffffffffffffffff) {
    local_190.piece_._M_str = (char *)(slot_type *)0x56b932;
    local_190.piece_._M_len = 7;
    local_100.piece_._M_len = local_1a8._M_len;
    local_100.piece_._M_str = local_1a8._M_str;
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_b0,(lts_20250127 *)&local_190,&local_100,pAVar5);
    std::__cxx11::string::operator=((string *)&local_130,(string *)local_b0);
    local_80._M_dataplus._M_p = (pointer)local_b0._0_8_;
    if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) goto LAB_001fcf07;
  }
  else {
    local_190.piece_._M_str = (char *)(slot_type *)0x6ec4c5;
    local_190.piece_._M_len = (size_t)&DAT_00000005;
    local_100.piece_._M_len = (size_t)pAVar6;
    if (local_1a8._M_len < pAVar6) {
      local_100.piece_._M_len = local_1a8._M_len;
    }
    local_100.piece_._M_str = local_1a8._M_str;
    local_b0._0_8_ = &DAT_00000008;
    local_b0._8_8_ = " import ";
    local_60.piece_._M_len = local_1a8._M_len - (long)local_140;
    if (local_1a8._M_len < local_140) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr");
    }
    local_60.piece_._M_str = local_140->digits_ + (long)((long)local_1a8._M_str + -0x10);
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_80,(lts_20250127 *)&local_190,&local_100,(AlphaNum *)local_b0,&local_60,in_R9)
    ;
    std::__cxx11::string::operator=((string *)&local_130,(string *)&local_80);
    local_b0._16_8_ = local_80.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
LAB_001fcf07:
      operator_delete(local_80._M_dataplus._M_p,local_b0._16_8_ + 1);
    }
  }
  text_01._M_str = "$statement$ as $alias$\n";
  text_01._M_len = 0x17;
  io::Printer::Print<char[10],std::__cxx11::string,char[6],std::__cxx11::string>
            (pPVar3->printer_,text_01,(char (*) [10])"statement",&local_130,(char (*) [6])0x564a7c,
             &local_160);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::try_emplace_impl<std::basic_string_view<char,std::char_traits<char>>const&>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_190,
             (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&pPVar3->import_map_,&local_110);
  std::__cxx11::string::_M_assign((string *)((long)local_190.piece_._M_str + 0x20));
  local_100.piece_._M_len = (size_t)seen_aliases;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
  ::EmplaceDecomposable::operator()
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
              *)&local_190,&local_100,&local_160,&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar2) {
    operator_delete(local_130._M_dataplus._M_p,
                    CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                             local_130.field_2._M_local_buf[0]) + 1);
  }
LAB_001fcfa4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void PyiGenerator::PrintImportForDescriptor(
    const FileDescriptor& desc, absl::flat_hash_set<std::string>* seen_aliases,
    bool* has_importlib) const {
  const absl::string_view filename = desc.name();
  std::string module_name_owned = StrippedModuleName(filename);
  absl::string_view module_name(module_name_owned);
  size_t last_dot_pos = module_name.rfind('.');
  std::string alias = absl::StrCat("_", module_name.substr(last_dot_pos + 1));
  // Generate a unique alias by adding _1 suffixes until we get an unused alias.
  while (seen_aliases->find(alias) != seen_aliases->end()) {
    absl::StrAppend(&alias, "_1");
  }
  if (ContainsPythonKeyword(module_name)) {
    if (*has_importlib == false) {
      printer_->Print("import importlib\n");
      *has_importlib = true;
    }
    printer_->Print("$alias$ = importlib.import_module('$name$')\n", "alias",
                    alias, "name", module_name);
  } else {
    std::string import_statement;
    if (last_dot_pos == std::string::npos) {
      import_statement = absl::StrCat("import ", module_name);
    } else {
      import_statement =
          absl::StrCat("from ", module_name.substr(0, last_dot_pos), " import ",
                       module_name.substr(last_dot_pos + 1));
    }
    printer_->Print("$statement$ as $alias$\n", "statement", import_statement,
                    "alias", alias);
    import_map_[filename] = alias;
    seen_aliases->insert(alias);
  }
}